

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O0

void quantize3_ord_dither
               (j_decompress_ptr cinfo,JSAMPARRAY input_buf,JSAMPARRAY output_buf,int num_rows)

{
  byte bVar1;
  JDIMENSION JVar2;
  int iVar3;
  jpeg_color_quantizer *pjVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  _func_void_j_decompress_ptr *p_Var8;
  _func_void_j_decompress_ptr *p_Var9;
  _func_void_j_decompress_ptr_boolean *p_Var10;
  byte *pbVar11;
  byte *pbVar12;
  JDIMENSION local_80;
  JDIMENSION width;
  JDIMENSION col;
  int row;
  int col_index;
  int row_index;
  int *dither2;
  int *dither1;
  int *dither0;
  JSAMPROW colorindex2;
  JSAMPROW colorindex1;
  JSAMPROW colorindex0;
  JSAMPROW output_ptr;
  JSAMPROW input_ptr;
  int pixcode;
  my_cquantize_ptr cquantize;
  int num_rows_local;
  JSAMPARRAY output_buf_local;
  JSAMPARRAY input_buf_local;
  
  pjVar4 = cinfo->cquantize;
  lVar5 = *(long *)pjVar4[1].finish_pass;
  lVar6 = *(long *)(pjVar4[1].finish_pass + 8);
  lVar7 = *(long *)(pjVar4[1].finish_pass + 0x10);
  JVar2 = cinfo->output_width;
  for (width = 0; (int)width < num_rows; width = width + 1) {
    iVar3 = *(int *)((long)&pjVar4[2].color_quantize + 4);
    output_ptr = input_buf[(int)width];
    p_Var8 = pjVar4[2].finish_pass;
    p_Var9 = pjVar4[2].new_color_map;
    p_Var10 = pjVar4[3].start_pass;
    col = 0;
    colorindex0 = output_buf[(int)width];
    for (local_80 = JVar2; local_80 != 0; local_80 = local_80 - 1) {
      pbVar11 = output_ptr + 1;
      bVar1 = *output_ptr;
      pbVar12 = output_ptr + 2;
      output_ptr = output_ptr + 3;
      *colorindex0 = *(char *)(lVar7 + (int)((uint)*pbVar12 +
                                            *(int *)(p_Var10 +
                                                    (long)(int)col * 4 + (long)iVar3 * 0x40))) +
                     *(char *)(lVar6 + (int)((uint)*pbVar11 +
                                            *(int *)(p_Var9 + (long)(int)col * 4 +
                                                              (long)iVar3 * 0x40))) +
                     *(char *)(lVar5 + (int)((uint)bVar1 +
                                            *(int *)(p_Var8 + (long)(int)col * 4 +
                                                              (long)iVar3 * 0x40)));
      col = col + 1 & 0xf;
      colorindex0 = colorindex0 + 1;
    }
    *(uint *)((long)&pjVar4[2].color_quantize + 4) = iVar3 + 1U & 0xf;
  }
  return;
}

Assistant:

METHODDEF(void)
quantize3_ord_dither(j_decompress_ptr cinfo, JSAMPARRAY input_buf,
                     JSAMPARRAY output_buf, int num_rows)
/* Fast path for out_color_components==3, with ordered dithering */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;
  register int pixcode;
  register JSAMPROW input_ptr;
  register JSAMPROW output_ptr;
  JSAMPROW colorindex0 = cquantize->colorindex[0];
  JSAMPROW colorindex1 = cquantize->colorindex[1];
  JSAMPROW colorindex2 = cquantize->colorindex[2];
  int *dither0;                 /* points to active row of dither matrix */
  int *dither1;
  int *dither2;
  int row_index, col_index;     /* current indexes into dither matrix */
  int row;
  JDIMENSION col;
  JDIMENSION width = cinfo->output_width;

  for (row = 0; row < num_rows; row++) {
    row_index = cquantize->row_index;
    input_ptr = input_buf[row];
    output_ptr = output_buf[row];
    dither0 = cquantize->odither[0][row_index];
    dither1 = cquantize->odither[1][row_index];
    dither2 = cquantize->odither[2][row_index];
    col_index = 0;

    for (col = width; col > 0; col--) {
      pixcode  = colorindex0[(*input_ptr++) + dither0[col_index]];
      pixcode += colorindex1[(*input_ptr++) + dither1[col_index]];
      pixcode += colorindex2[(*input_ptr++) + dither2[col_index]];
      *output_ptr++ = (JSAMPLE)pixcode;
      col_index = (col_index + 1) & ODITHER_MASK;
    }
    row_index = (row_index + 1) & ODITHER_MASK;
    cquantize->row_index = row_index;
  }
}